

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_z2_chain_vine.cpp
# Opt level: O3

void __thiscall
Chain_matrix_z2_vine_insertion<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>
::test_method(Chain_matrix_z2_vine_insertion<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>
              *this)

{
  long *plVar1;
  void *pvVar2;
  Column_settings *pCVar3;
  undefined8 uVar4;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>
  m1;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>
  m2;
  function<bool_(unsigned_int,_unsigned_int)> local_278;
  function<bool_(unsigned_int,_unsigned_int)> local_258;
  function<bool_(unsigned_int,_unsigned_int)> local_238;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>
  local_218;
  undefined1 local_120 [8];
  _Any_data _Stack_118;
  _Manager_type local_108;
  
  local_278.super__Function_base._M_functor._8_8_ = 0;
  local_278.super__Function_base._M_functor._M_unused._M_object = birth_comparator;
  local_278._M_invoker =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  local_278.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  local_258.super__Function_base._M_functor._8_8_ = 0;
  local_258.super__Function_base._M_functor._M_unused._M_object =
       Gudhi::persistence_matrix::_no_G_death_comparator;
  local_258._M_invoker =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  local_258.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  pCVar3 = (Column_settings *)operator_new(0x38);
  (pCVar3->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (pCVar3->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.list.
  ptr = (char *)0x0;
  (pCVar3->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.list.
  sz = 0;
  (pCVar3->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  requested_size = 0x18;
  (pCVar3->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  next_size = 0x20;
  (pCVar3->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  start_size = 0x20;
  (pCVar3->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  max_size = 0;
  local_218.colSettings_ = pCVar3;
  std::function<bool_(unsigned_int,_unsigned_int)>::function
            ((function<bool_(unsigned_int,_unsigned_int)> *)local_120,&local_278);
  std::function<bool_(unsigned_int,_unsigned_int)>::function(&local_238,&local_258);
  local_218.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
  _M_unused._M_object = (void *)0x0;
  local_218.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       0;
  local_218.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_218.matrix_.super_Chain_vine_swap_option.birthComp_._M_invoker = (_Invoker_type)local_108;
  if ((_Manager_type)_Stack_118._8_8_ != (_Manager_type)0x0) {
    local_218.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
    _M_unused._M_object = (void *)local_120;
    local_218.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_
         = _Stack_118._0_8_;
    local_218.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
         (_Manager_type)_Stack_118._8_8_;
  }
  local_218.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor.
  _M_unused._M_object = (void *)0x0;
  local_218.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_ =
       0;
  local_218.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_218.matrix_.super_Chain_vine_swap_option.deathComp_._M_invoker = local_238._M_invoker;
  if (local_238.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_218.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor.
    _M_unused._M_object = local_238.super__Function_base._M_functor._M_unused._M_object;
    local_218.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_
         = local_238.super__Function_base._M_functor._8_8_;
    local_218.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
         local_238.super__Function_base._M_manager;
  }
  local_218.matrix_.matrix_._M_h._M_buckets = &local_218.matrix_.matrix_._M_h._M_single_bucket;
  local_218.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_218.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_218.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_218.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.matrix_.matrix_._M_h._M_bucket_count = 1;
  local_218.matrix_.matrix_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_218.matrix_.matrix_._M_h._M_element_count = 0;
  local_218.matrix_.matrix_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_218.matrix_.matrix_._M_h._M_rehash_policy._M_next_resize = 0;
  local_218.matrix_.matrix_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_218.matrix_.pivotToColumnIndex_._M_h._M_buckets =
       &local_218.matrix_.pivotToColumnIndex_._M_h._M_single_bucket;
  local_218.matrix_.pivotToColumnIndex_._M_h._M_bucket_count = 1;
  local_218.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_218.matrix_.pivotToColumnIndex_._M_h._M_element_count = 0;
  local_218.matrix_.pivotToColumnIndex_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_218.matrix_.pivotToColumnIndex_._M_h._M_rehash_policy._M_next_resize = 0;
  local_218.matrix_.pivotToColumnIndex_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_218.matrix_.nextIndex_ = 0;
  local_218.matrix_.colSettings_ = pCVar3;
  if (local_258.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_258.super__Function_base._M_manager)
              ((_Any_data *)&local_258,(_Any_data *)&local_258,__destroy_functor);
  }
  if (local_278.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_278.super__Function_base._M_manager)
              ((_Any_data *)&local_278,(_Any_data *)&local_278,__destroy_functor);
  }
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>>
            ();
  pvVar2 = *(void **)(local_258.super__Function_base._M_functor._8_8_ + -0x18);
  uVar4 = local_258.super__Function_base._M_functor._8_8_ + -0x18;
  if (pvVar2 != (void *)0x0) {
    plVar1 = (long *)(local_258.super__Function_base._M_functor._8_8_ + -8);
    local_258.super__Function_base._M_functor._8_8_ =
         local_258.super__Function_base._M_functor._8_8_ + -0x18;
    operator_delete(pvVar2,*plVar1 - (long)pvVar2);
    uVar4 = local_258.super__Function_base._M_functor._8_8_;
  }
  local_258.super__Function_base._M_functor._8_8_ = uVar4 + -0x18;
  pvVar2 = *(void **)(uVar4 + -0x18);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)(uVar4 + -8) - (long)pvVar2);
  }
  local_238.super__Function_base._M_functor._8_8_ = 0;
  local_238.super__Function_base._M_functor._M_unused._M_object = birth_comparator;
  local_238._M_invoker =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  local_238.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  local_278.super__Function_base._M_functor._8_8_ = 0;
  local_278.super__Function_base._M_functor._M_unused._M_object =
       Gudhi::persistence_matrix::_no_G_death_comparator;
  local_278._M_invoker =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  local_278.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  local_120 = (undefined1  [8])operator_new(0x38);
  (((Column_settings *)local_120)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((Column_settings *)local_120)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (((Column_settings *)local_120)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (((Column_settings *)local_120)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  (((Column_settings *)local_120)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (((Column_settings *)local_120)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (((Column_settings *)local_120)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>
              *)(local_120 + 8),
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&local_258,(Column_settings *)local_120,&local_238,&local_278);
  if (local_278.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_278.super__Function_base._M_manager)
              ((_Any_data *)&local_278,(_Any_data *)&local_278,__destroy_functor);
  }
  if (local_238.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_238.super__Function_base._M_manager)
              ((_Any_data *)&local_238,(_Any_data *)&local_238,__destroy_functor);
  }
  test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>
            (&local_218,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>
              *)local_120);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>
  ::~Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>
             *)local_120);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_258);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>
  ::~Matrix(&local_218);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Chain_matrix_z2_vine_insertion, Matrix, full_matrices) {
  Matrix m1(birth_comparator, Gudhi::persistence_matrix::_no_G_death_comparator);

  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  orderedBoundaries.pop_back();
  orderedBoundaries.pop_back();

  Matrix m2(orderedBoundaries, birth_comparator, Gudhi::persistence_matrix::_no_G_death_comparator);

  test_chain_boundary_insertion<Matrix>(m1, m2);
}